

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mct.c
# Opt level: O0

void jpc_irct(jas_matrix_t *c0,jas_matrix_t *c1,jas_matrix_t *c2)

{
  jpc_fix_t jVar1;
  jpc_fix_t jVar2;
  jas_seqent_t jVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  jas_matind_t jVar7;
  int v;
  int u;
  int y;
  int b;
  int g;
  int r;
  jpc_fix_t *c2p;
  jpc_fix_t *c1p;
  jpc_fix_t *c0p;
  int j;
  int i;
  int numcols;
  int numrows;
  jas_matrix_t *c2_local;
  jas_matrix_t *c1_local;
  jas_matrix_t *c0_local;
  
  jVar7 = jas_matrix_numrows(c0);
  iVar4 = (int)jVar7;
  jVar7 = jas_matrix_numcols(c0);
  iVar5 = (int)jVar7;
  jVar7 = jas_matrix_numrows(c1);
  if (jVar7 == iVar4) {
    jVar7 = jas_matrix_numcols(c1);
    if (jVar7 == iVar5) {
      jVar7 = jas_matrix_numrows(c2);
      if (jVar7 == iVar4) {
        jVar7 = jas_matrix_numcols(c2);
        if (jVar7 == iVar5) {
          for (c0p._4_4_ = 0; c0p._4_4_ < iVar4; c0p._4_4_ = c0p._4_4_ + 1) {
            c1p = jas_matrix_getref(c0,(long)c0p._4_4_,0);
            c2p = jas_matrix_getref(c1,(long)c0p._4_4_,0);
            _g = jas_matrix_getref(c2,(long)c0p._4_4_,0);
            for (c0p._0_4_ = iVar5; 0 < (int)c0p; c0p._0_4_ = (int)c0p + -1) {
              jVar1 = *c1p;
              jVar2 = *c2p;
              jVar3 = *_g;
              iVar6 = jas_fast32_asr((long)((int)jVar2 + (int)jVar3),2);
              iVar6 = (int)jVar1 - iVar6;
              *c1p = (long)((int)jVar3 + iVar6);
              *c2p = (long)iVar6;
              *_g = (long)((int)jVar2 + iVar6);
              _g = _g + 1;
              c2p = c2p + 1;
              c1p = c1p + 1;
            }
          }
          return;
        }
      }
    }
  }
  __assert_fail("jas_matrix_numrows(c1) == numrows && jas_matrix_numcols(c1) == numcols && jas_matrix_numrows(c2) == numrows && jas_matrix_numcols(c2) == numcols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                ,0x93,"void jpc_irct(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
}

Assistant:

void jpc_irct(jas_matrix_t *c0, jas_matrix_t *c1, jas_matrix_t *c2)
{
	int numrows;
	int numcols;
	int i;
	int j;
	jpc_fix_t *c0p;
	jpc_fix_t *c1p;
	jpc_fix_t *c2p;

	numrows = jas_matrix_numrows(c0);
	numcols = jas_matrix_numcols(c0);

	/* All three matrices must have the same dimensions. */
	assert(jas_matrix_numrows(c1) == numrows && jas_matrix_numcols(c1) == numcols
	  && jas_matrix_numrows(c2) == numrows && jas_matrix_numcols(c2) == numcols);

	for (i = 0; i < numrows; i++) {
		c0p = jas_matrix_getref(c0, i, 0);
		c1p = jas_matrix_getref(c1, i, 0);
		c2p = jas_matrix_getref(c2, i, 0);
		for (j = numcols; j > 0; --j) {
			int r;
			int g;
			int b;
			int y;
			int u;
			int v;
			y = *c0p;
			u = *c1p;
			v = *c2p;
			//g = y - ((u + v) >> 2);
			g = y - jpc_fix_asr(u + v, 2);
			r = v + g;
			b = u + g;
			*c0p++ = r;
			*c1p++ = g;
			*c2p++ = b;
		}
	}
}